

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

void des3_cbc3_cbc_decrypt(ssh_cipher *ciph,void *vdata,int len)

{
  LR LVar1;
  LR LVar2;
  LR ciphertext;
  LR lr;
  uint8_t *data;
  des3_cbc3_ctx *ctx;
  int len_local;
  void *vdata_local;
  ssh_cipher *ciph_local;
  
  lr = (LR)vdata;
  for (ctx._4_4_ = len; 0 < ctx._4_4_; ctx._4_4_ = ctx._4_4_ + -8) {
    LVar1 = des_load_lr((void *)lr);
    LVar1 = des_IP(LVar1);
    LVar2 = des_inner_cipher(LVar1,(des_keysched *)(ciph + -0x13),0xf,0xffffffffffffffff);
    LVar2 = des_xor_lr(LVar2,*(LR *)(ciph + -1));
    *(LR *)(ciph + -1) = LVar1;
    LVar1 = des_xor_lr(LVar2,*(LR *)(ciph + -2));
    LVar1 = des_inner_cipher(LVar1,(des_keysched *)(ciph + -0x23),0,1);
    *(LR *)(ciph + -2) = LVar1;
    LVar2 = des_inner_cipher(LVar1,(des_keysched *)(ciph + -0x33),0xf,0xffffffffffffffff);
    LVar2 = des_xor_lr(LVar2,*(LR *)(ciph + -3));
    *(LR *)(ciph + -3) = LVar1;
    LVar1 = des_FP(LVar2);
    des_store_lr((void *)lr,LVar1);
    lr = (LR)((long)lr + 8);
  }
  return;
}

Assistant:

static void des3_cbc3_cbc_decrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des3_cbc3_ctx *ctx = container_of(ciph, struct des3_cbc3_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    for (; len > 0; len -= 8, data += 8) {
        /* Load and IP the input */
        LR lr = des_IP(des_load_lr(data));
        LR ciphertext;

        /* Do three passes of CBC, with the middle one inverted. */
        ciphertext = lr;
        lr = des_inner_cipher(ciphertext, &ctx->sched[2], DECIPHER);
        lr = des_xor_lr(lr, ctx->iv[2]);
        ctx->iv[2] = ciphertext;

        lr = des_xor_lr(lr, ctx->iv[1]);
        lr = des_inner_cipher(lr, &ctx->sched[1], ENCIPHER);
        ctx->iv[1] = lr;

        ciphertext = lr;
        lr = des_inner_cipher(ciphertext, &ctx->sched[0], DECIPHER);
        lr = des_xor_lr(lr, ctx->iv[0]);
        ctx->iv[0] = ciphertext;

        des_store_lr(data, des_FP(lr));
    }
}